

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

char * __thiscall dmlc::DateLogger::HumanDate(DateLogger *this)

{
  undefined1 local_58 [8];
  tm now;
  tm *pnow;
  time_t time_value;
  DateLogger *this_local;
  
  time_value = (time_t)this;
  pnow = (tm *)time((time_t *)0x0);
  now.tm_zone = (char *)localtime_r((time_t *)&pnow,(tm *)local_58);
  snprintf(this->buffer_,9,"%02d:%02d:%02d",(ulong)(uint)((tm *)now.tm_zone)->tm_hour,
           (ulong)(uint)((tm *)now.tm_zone)->tm_min,(ulong)(uint)((tm *)now.tm_zone)->tm_sec);
  return this->buffer_;
}

Assistant:

const char *HumanDate() {
#ifndef _LIBCPP_SGX_CONFIG
#if defined(_MSC_VER)
    _strtime_s(buffer_, sizeof(buffer_));
#else
    time_t time_value = time(NULL);
    struct tm *pnow;
#if !defined(_WIN32)
    struct tm now;
    pnow = localtime_r(&time_value, &now);
#else
    pnow = localtime(&time_value); // NOLINT(*)
#endif
    snprintf(buffer_, sizeof(buffer_), "%02d:%02d:%02d",
             pnow->tm_hour, pnow->tm_min, pnow->tm_sec);
#endif
#endif // _LIBCPP_SGX_CONFIG
    return buffer_;
  }